

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

void * SetData(node *p,dataid Id,datatype Type,void *Data)

{
  ulong uVar1;
  size_t __n;
  ulong uVar2;
  size_t sVar3;
  void *pvVar4;
  
  __n = Node_DataSize(p,Id,(ulong)((uint)Type & 0x3f),Data,0x2a);
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (__n == uVar2) break;
    uVar1 = uVar2 + 1;
  } while (*(char *)((long)Data + uVar2) == '\0');
  sVar3 = NodeTypeSize(Type);
  if (sVar3 == 0x100) {
    Node_RemoveData(p,Id,Type);
    if (uVar2 < __n) {
LAB_0011e28e:
      pvVar4 = Node_AddData(p,Id,Type,Data);
      return pvVar4;
    }
  }
  else {
    if (uVar2 < __n) {
      pvVar4 = Node_GetData(p,Id,Type);
      if (pvVar4 != (void *)0x0) {
        sVar3 = NodeTypeSize(Type);
        if (__n != sVar3) {
          __assert_fail("Size==NodeTypeSize(Type)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                        ,0x23f,"void *SetData(node *, dataid, datatype, const void *)");
        }
        pvVar4 = memcpy(pvVar4,Data,__n);
        return pvVar4;
      }
      goto LAB_0011e28e;
    }
    Node_RemoveData(p,Id,Type);
  }
  return (void *)0x0;
}

Assistant:

static void* SetData(node* p, dataid Id, datatype Type, const void* Data)
{
    size_t i,Size = Node_DataSize(p,Id,Type&TYPE_MASK,Data,META_PARAM_UNSET); // META_PARAM_UNSET is neutral for the type

    for (i=0;i<Size;++i)
        if (((uint8_t*)Data)[i])
            break;

    if (NodeTypeSize(Type)==MAXDATA) // variable size
    {
        Node_RemoveData(p,Id,Type);

        // do not write anything if the value is 0
        if (i<Size)
            return Node_AddData(p,Id,Type,Data);
        else
            return NULL; // TODO: remove the pre-existing data with Node_RemoveData() ?
    }
    else
    {
        // do not write anything if the value is 0
        if (i<Size)
        {
            void *v = Node_GetData(p,Id,Type);
            if (!v)
                return Node_AddData(p,Id,Type,Data);
            else
            {
                assert(Size==NodeTypeSize(Type));
                memcpy(v,Data,Size);
            }
            return v;
        }
        else
            Node_RemoveData(p,Id,Type);
        return NULL;
    }
}